

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isLevelSampleResultValid
               (ConstPixelBufferAccess *level,Sampler *sampler,FilterMode filterMode,
               LookupPrecision *prec,Vec3 *coord,Vec4 *result)

{
  Vec4 *result_local;
  Vec3 *coord_local;
  LookupPrecision *prec_local;
  FilterMode filterMode_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level_local;
  
  if (filterMode == LINEAR) {
    level_local._7_1_ = isLinearSampleResultValid(level,sampler,prec,coord,result);
  }
  else {
    level_local._7_1_ =
         isNearestSampleResultValid<tcu::LookupPrecision,float>(level,sampler,prec,coord,result);
  }
  return level_local._7_1_;
}

Assistant:

static bool isLevelSampleResultValid (const ConstPixelBufferAccess&		level,
									  const Sampler&					sampler,
									  const Sampler::FilterMode			filterMode,
									  const LookupPrecision&			prec,
									  const Vec3&						coord,
									  const Vec4&						result)
{
	if (filterMode == Sampler::LINEAR)
		return isLinearSampleResultValid(level, sampler, prec, coord, result);
	else
		return isNearestSampleResultValid(level, sampler, prec, coord, result);
}